

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseBreaks.cpp
# Opt level: O2

Expr * createListOfOneGoto(Block *container,Block *gotoTarget)

{
  pointer ppEVar1;
  pointer __p;
  vector<Expr_*,_std::allocator<Expr_*>_> exprs;
  vector<Expr_*,_std::allocator<Expr_*>_> local_50;
  _Head_base<0UL,_Expr_*,_false> local_38;
  _Vector_base<Expr_*,_std::allocator<Expr_*>_> local_30;
  Block *local_18;
  
  local_18 = gotoTarget;
  std::make_unique<GotoExpr,Block*&>
            ((Block **)
             &local_50.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
              super__Vector_impl_data._M_finish);
  generatePhiAssignments((vector<Expr_*,_std::allocator<Expr_*>_> *)&local_30,container,local_18);
  local_50.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.super__Vector_impl_data.
  _M_start = local_50.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  std::vector<Expr*,std::allocator<Expr*>>::emplace_back<Expr*>
            ((vector<Expr*,std::allocator<Expr*>> *)&local_30,(Expr **)&local_50);
  std::make_unique<ExprList,std::vector<Expr*,std::allocator<Expr*>>>(&local_50);
  local_38._M_head_impl =
       (Expr *)local_50.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_50.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  Block::addOwnership(container,(unique_ptr<Expr,_std::default_delete<Expr>_> *)&local_38);
  if (local_38._M_head_impl != (Expr *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Expr[1])();
  }
  ppEVar1 = local_50.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_38._M_head_impl = (Expr *)0x0;
  local_50.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_50.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = ppEVar1;
  Block::addOwnership(container,
                      (unique_ptr<Expr,_std::default_delete<Expr>_> *)
                      &local_50.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  if ((Expr *)local_50.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (Expr *)0x0) {
    (*(*(_func_int ***)
        local_50.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage)[1])();
  }
  local_50.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (local_50.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    (**(code **)&(*local_50.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                   super__Vector_impl_data._M_start)->kind)();
  }
  std::_Vector_base<Expr_*,_std::allocator<Expr_*>_>::~_Vector_base(&local_30);
  if (local_50.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    (**(code **)&(*local_50.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                   super__Vector_impl_data._M_finish)->kind)();
  }
  return (Expr *)ppEVar1;
}

Assistant:

static Expr* createListOfOneGoto(Block* container, Block* gotoTarget) {
    auto gotoExpr = std::make_unique<GotoExpr>(gotoTarget);

    std::vector<Expr*> exprs = generatePhiAssignments(container, gotoTarget);
    exprs.push_back(gotoExpr.get());
    auto list = std::make_unique<ExprList>(std::move(exprs));

    container->addOwnership(std::move(gotoExpr));
    auto* result = list.get();
    container->addOwnership(std::move(list));
    return result;
}